

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Entry.cpp
# Opt level: O1

Variant __thiscall cali::Entry::value(Entry *this,cali_id_t attr_id)

{
  cali_variant_t *pcVar1;
  Variant *pVVar2;
  Node *pNVar3;
  Variant VVar4;
  
  pNVar3 = this->m_node;
  if (pNVar3 != (Node *)0x0) {
    if (pNVar3->m_id == attr_id) {
      pVVar2 = &this->m_value;
      pcVar1 = &(this->m_value).m_v;
LAB_00188e2c:
      VVar4.m_v.value.v_uint = (pcVar1->value).v_uint;
      VVar4.m_v.type_and_size = (pVVar2->m_v).type_and_size;
      return (Variant)VVar4.m_v;
    }
    do {
      if (pNVar3->m_attribute == attr_id) {
        pVVar2 = &pNVar3->m_data;
        pcVar1 = &(pNVar3->m_data).m_v;
        goto LAB_00188e2c;
      }
      pNVar3 = *(Node **)((long)&(((pNVar3->super_LockfreeIntrusiveTree<cali::Node>).m_me)->
                                 super_LockfreeIntrusiveTree<cali::Node>).m_me +
                         (pNVar3->super_LockfreeIntrusiveTree<cali::Node>).m_node);
    } while (pNVar3 != (Node *)0x0);
  }
  return (cali_variant_t)ZEXT816(0);
}

Assistant:

Variant Entry::value(cali_id_t attr_id) const
{
    if (m_node && m_node->id() == attr_id)
        return m_value;

    for (const Node* node = m_node; node; node = node->parent())
        if (node->attribute() == attr_id)
            return node->data();

    return Variant();
}